

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

int resampler_run_zoh(resampler *r,float **out_,float *out_end)

{
  unsigned_long_long uVar1;
  int iVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  bigint phase_inc;
  bigint phase;
  float *in_end;
  float *in;
  float *out;
  int used;
  float *in_;
  int in_size;
  float *out_end_local;
  float **out__local;
  resampler *r_local;
  
  pfVar3 = (float *)((long)r + (long)r->write_filled * -4 + (long)r->write_pos * 4 + 0x148);
  used = 0;
  iVar2 = r->write_filled + -1;
  if (0 < iVar2) {
    phase = r->phase;
    uVar1 = (r->phase_inc).quad;
    in = pfVar3;
    out = *out_;
    do {
      if (out_end <= out) break;
      pfVar5 = out + 1;
      *out = *in;
      uVar4 = uVar1 + phase.quad;
      in = in + (uVar4 >> 0x20);
      phase.quad = uVar4 & 0xffffffff;
      out = pfVar5;
    } while (in < pfVar3 + iVar2);
    r->phase = phase;
    *out_ = out;
    used = (int)((long)in - (long)pfVar3 >> 2);
    r->write_filled = r->write_filled - used;
  }
  return used;
}

Assistant:

static int resampler_run_zoh(resampler * r, float ** out_, float * out_end)
{
    int in_size = r->write_filled;
    float const* in_ = r->buffer_in + resampler_buffer_size + r->write_pos - r->write_filled;
    int used = 0;
    in_size -= 1;
    if ( in_size > 0 )
    {
        float* out = *out_;
        float const* in = in_;
        float const* const in_end = in + in_size;
        bigint phase = r->phase;
        bigint phase_inc = r->phase_inc;
        do
        {
            if ( out >= out_end )
                break;

            *out++ = *in;
            
            phase.quad += phase_inc.quad;
            
            ADD_HI(in, phase);
            
            CLEAR_HI(phase);
        }
        while ( in < in_end );
        
        r->phase = phase;
        *out_ = out;
        
        used = (int)(in - in_);
        
        r->write_filled -= used;
    }
    
    return used;
}